

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUITabControl::CGUITabControl
          (CGUITabControl *this,IGUIEnvironment *environment,IGUIElement *parent,
          rect<int> *rectangle,bool fillbackground,bool border,s32 id)

{
  rect<int> rectangle_00;
  int iVar1;
  IGUIButton *pIVar2;
  undefined8 uVar3;
  undefined8 *in_RCX;
  vector2d<int> in_RDX;
  vector2d<int> in_RSI;
  CGUITabControl *in_RDI;
  EGUI_ALIGNMENT in_R8D;
  byte in_R9B;
  IGUISpriteBank *sprites;
  IGUISkin *skin;
  array<irr::gui::IGUITab_*> *this_00;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  rect<int> *in_stack_ffffffffffffff50;
  IGUIElement *in_stack_ffffffffffffff58;
  long *plVar4;
  IGUIEnvironment *in_stack_ffffffffffffff60;
  void **in_stack_ffffffffffffff68;
  EGUI_ALIGNMENT in_stack_ffffffffffffff70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  long *local_40;
  undefined8 local_38;
  array<irr::gui::IGUITab_*> *local_30;
  byte local_22;
  byte local_21;
  undefined8 *local_20;
  
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B & 1;
  local_20 = in_RCX;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI->field_0x188);
  local_38 = *local_20;
  this_00 = (array<irr::gui::IGUITab_*> *)local_20[1];
  rectangle_00.LowerRightCorner = in_RSI;
  rectangle_00.UpperLeftCorner = in_RDX;
  local_30 = this_00;
  IGUITabControl::IGUITabControl
            ((IGUITabControl *)CONCAT44(in_R8D,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (s32)((ulong)in_stack_ffffffffffffff50 >> 0x20),rectangle_00);
  *(long *)in_RDI = 0x4489f8;
  *(undefined8 *)&in_RDI->field_0x188 = 0x448bd8;
  core::array<irr::gui::IGUITab_*>::array(this_00);
  in_RDI->ActiveTabIndex = -1;
  in_RDI->Border = (bool)(local_22 & 1);
  in_RDI->FillBackground = (bool)(local_21 & 1);
  in_RDI->ScrollControl = false;
  in_RDI->TabHeight = 0;
  in_RDI->VerticalAlignment = EGUIA_UPPERLEFT;
  in_RDI->UpButton = (IGUIButton *)0x0;
  in_RDI->DownButton = (IGUIButton *)0x0;
  in_RDI->TabMaxWidth = 0;
  in_RDI->CurrentScrollTabIndex = 0;
  in_RDI->TabExtraWidth = 0x14;
  local_40 = (long *)(**(code **)(**(long **)&in_RDI->field_0x128 + 0x60))();
  local_48 = 0;
  in_RDI->TabHeight = 0x20;
  if (local_40 != (long *)0x0) {
    local_48 = (**(code **)(*local_40 + 0x40))();
    iVar1 = (**(code **)(*local_40 + 0x10))(local_40,7);
    in_RDI->TabHeight = iVar1 + 2;
  }
  plVar4 = *(long **)&in_RDI->field_0x128;
  core::rect<int>::rect
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
             (int)((ulong)this_00 >> 0x20),(int)this_00);
  pIVar2 = (IGUIButton *)(**(code **)(*plVar4 + 0xb8))(plVar4,local_58,in_RDI,0xffffffff,0);
  in_RDI->UpButton = pIVar2;
  if (in_RDI->UpButton != (IGUIButton *)0x0) {
    (*(in_RDI->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x31])
              (in_RDI->UpButton,local_48);
    (*(in_RDI->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])
              (in_RDI->UpButton,0);
    (*(in_RDI->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])
              (in_RDI->UpButton,1);
    IGUIElement::setAlignment
              ((IGUIElement *)in_RDX,(EGUI_ALIGNMENT)((ulong)in_RCX >> 0x20),(EGUI_ALIGNMENT)in_RCX,
               in_R8D,in_stack_ffffffffffffff70);
    pIVar2 = in_RDI->UpButton;
    uVar3 = (**(code **)(**(long **)&in_RDI->field_0x128 + 0x98))();
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x24])(pIVar2,uVar3);
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((in_RDI->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3]
               + (long)&(in_RDI->UpButton->super_IGUIElement).super_IEventReceiver.
                        _vptr_IEventReceiver));
  }
  plVar4 = *(long **)&in_RDI->field_0x128;
  core::rect<int>::rect
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
             (int)((ulong)this_00 >> 0x20),(int)this_00);
  pIVar2 = (IGUIButton *)(**(code **)(*plVar4 + 0xb8))(plVar4,local_68,in_RDI,0xffffffff,0);
  in_RDI->DownButton = pIVar2;
  if (in_RDI->DownButton != (IGUIButton *)0x0) {
    (*(in_RDI->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x31])
              (in_RDI->DownButton,local_48);
    (*(in_RDI->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])
              (in_RDI->DownButton,0);
    (*(in_RDI->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])
              (in_RDI->DownButton,1);
    IGUIElement::setAlignment
              ((IGUIElement *)in_RDX,(EGUI_ALIGNMENT)((ulong)in_RCX >> 0x20),(EGUI_ALIGNMENT)in_RCX,
               in_R8D,in_stack_ffffffffffffff70);
    pIVar2 = in_RDI->DownButton;
    uVar3 = (**(code **)(**(long **)&in_RDI->field_0x128 + 0x98))();
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x24])(pIVar2,uVar3);
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((in_RDI->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver
                [-3] + (long)&(in_RDI->DownButton->super_IGUIElement).super_IEventReceiver.
                              _vptr_IEventReceiver));
  }
  (**(code **)(*(long *)in_RDI + 0x1a8))(in_RDI,0);
  refreshSprites(in_RDI);
  return;
}

Assistant:

CGUITabControl::CGUITabControl(IGUIEnvironment *environment,
		IGUIElement *parent, const core::rect<s32> &rectangle,
		bool fillbackground, bool border, s32 id) :
		IGUITabControl(environment, parent, id, rectangle),
		ActiveTabIndex(-1),
		Border(border), FillBackground(fillbackground), ScrollControl(false), TabHeight(0), VerticalAlignment(EGUIA_UPPERLEFT),
		UpButton(0), DownButton(0), TabMaxWidth(0), CurrentScrollTabIndex(0), TabExtraWidth(20)
{
#ifdef _DEBUG
	setDebugName("CGUITabControl");
#endif

	IGUISkin *skin = Environment->getSkin();
	IGUISpriteBank *sprites = 0;

	TabHeight = 32;

	if (skin) {
		sprites = skin->getSpriteBank();
		TabHeight = skin->getSize(gui::EGDS_BUTTON_HEIGHT) + 2;
	}

	UpButton = Environment->addButton(core::rect<s32>(0, 0, 10, 10), this);

	if (UpButton) {
		UpButton->setSpriteBank(sprites);
		UpButton->setVisible(false);
		UpButton->setSubElement(true);
		UpButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		UpButton->setOverrideFont(Environment->getBuiltInFont());
		UpButton->grab();
	}

	DownButton = Environment->addButton(core::rect<s32>(0, 0, 10, 10), this);

	if (DownButton) {
		DownButton->setSpriteBank(sprites);
		DownButton->setVisible(false);
		DownButton->setSubElement(true);
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		DownButton->setOverrideFont(Environment->getBuiltInFont());
		DownButton->grab();
	}

	setTabVerticalAlignment(EGUIA_UPPERLEFT);
	refreshSprites();
}